

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::initFromQuadrupleAPInt(IEEEFloat *this,APInt *api)

{
  uint64_t uVar1;
  ulong uVar2;
  uint uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  integerPart *piVar7;
  uint64_t mysignificand2;
  uint64_t mysignificand;
  uint64_t myexponent;
  uint64_t i2;
  uint64_t i1;
  APInt *api_local;
  IEEEFloat *this_local;
  
  uVar3 = APInt::getBitWidth(api);
  if (uVar3 != 0x80) {
    __assert_fail("api.getBitWidth()==128",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc1b,"void llvm::detail::IEEEFloat::initFromQuadrupleAPInt(const APInt &)");
  }
  puVar4 = APInt::getRawData(api);
  uVar1 = *puVar4;
  puVar4 = APInt::getRawData(api);
  uVar2 = puVar4[1];
  uVar5 = uVar2 >> 0x30 & 0x7fff;
  uVar6 = uVar2 & 0xffffffffffff;
  initialize(this,(fltSemantics *)semIEEEquad);
  uVar3 = partCount(this);
  if (uVar3 != 2) {
    __assert_fail("partCount()==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc23,"void llvm::detail::IEEEFloat::initFromQuadrupleAPInt(const APInt &)");
  }
  this->field_0x12 = this->field_0x12 & 0xf7 | (byte)(uVar2 >> 0x3f) << 3;
  if (((uVar5 == 0) && (uVar1 == 0)) && (uVar6 == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
  }
  else if (((uVar5 == 0x7fff) && (uVar1 == 0)) && (uVar6 == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8;
  }
  else if ((uVar5 == 0x7fff) && ((uVar1 != 0 || (uVar6 != 0)))) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 1;
    piVar7 = significandParts(this);
    *piVar7 = uVar1;
    piVar7 = significandParts(this);
    piVar7[1] = uVar6;
  }
  else {
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    this->exponent = (short)uVar5 + -0x3fff;
    piVar7 = significandParts(this);
    *piVar7 = uVar1;
    piVar7 = significandParts(this);
    piVar7[1] = uVar6;
    if (uVar5 == 0) {
      this->exponent = -0x3ffe;
    }
    else {
      piVar7 = significandParts(this);
      piVar7[1] = piVar7[1] | 0x1000000000000;
    }
  }
  return;
}

Assistant:

void IEEEFloat::initFromQuadrupleAPInt(const APInt &api) {
  assert(api.getBitWidth()==128);
  uint64_t i1 = api.getRawData()[0];
  uint64_t i2 = api.getRawData()[1];
  uint64_t myexponent = (i2 >> 48) & 0x7fff;
  uint64_t mysignificand  = i1;
  uint64_t mysignificand2 = i2 & 0xffffffffffffLL;

  initialize(&semIEEEquad);
  assert(partCount()==2);

  sign = static_cast<unsigned int>(i2>>63);
  if (myexponent==0 &&
      (mysignificand==0 && mysignificand2==0)) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7fff &&
             (mysignificand==0 && mysignificand2==0)) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x7fff &&
             (mysignificand!=0 || mysignificand2 !=0)) {
    // exponent meaningless
    category = fcNaN;
    significandParts()[0] = mysignificand;
    significandParts()[1] = mysignificand2;
  } else {
    category = fcNormal;
    exponent = myexponent - 16383;
    significandParts()[0] = mysignificand;
    significandParts()[1] = mysignificand2;
    if (myexponent==0)          // denormal
      exponent = -16382;
    else
      significandParts()[1] |= 0x1000000000000LL;  // integer bit
  }
}